

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_session.c
# Opt level: O0

char * get_first_line(int state)

{
  char acStack_38 [8];
  char h [32];
  char *head;
  int state_local;
  
  h[8] = '\0';
  h[9] = '\0';
  h[10] = '\0';
  h[0xb] = '\0';
  h[0xc] = '\0';
  h[0xd] = '\0';
  h[0xe] = '\0';
  h[0xf] = '\0';
  h[0x10] = '\0';
  h[0x11] = '\0';
  h[0x12] = '\0';
  h[0x13] = '\0';
  h[0x14] = '\0';
  h[0x15] = '\0';
  h[0x16] = '\0';
  h[0x17] = '\0';
  acStack_38[0] = '\0';
  acStack_38[1] = '\0';
  acStack_38[2] = '\0';
  acStack_38[3] = '\0';
  acStack_38[4] = '\0';
  acStack_38[5] = '\0';
  acStack_38[6] = '\0';
  acStack_38[7] = '\0';
  h[0] = '\0';
  h[1] = '\0';
  h[2] = '\0';
  h[3] = '\0';
  h[4] = '\0';
  h[5] = '\0';
  h[6] = '\0';
  h[7] = '\0';
  switch(state) {
  case 100:
    strcat(acStack_38,"HTTP/1.1 100 Continue\r\n");
    break;
  case 0x65:
    strcat(acStack_38,"HTTP/1.1 101 Switching Protocols\r\n");
    break;
  default:
    perror("Unknow state code!");
    exit(1);
  case 200:
    strcat(acStack_38,"HTTP/1.1 200 OK\r\n");
    break;
  case 0xc9:
    strcat(acStack_38,"HTTP/1.1 201 Created\r\n");
    break;
  case 0xca:
    strcat(acStack_38,"HTTP/1.1 202 Accepted\r\n");
    break;
  case 0xcb:
    strcat(acStack_38,"HTTP/1.1 203 Non-authoritative Information\\r\n");
    break;
  case 0xcc:
    strcat(acStack_38,"HTTP/1.1 204 No Content\r\n");
    break;
  case 0xcd:
    strcat(acStack_38,"HTTP/1.1 205 Reset Content\r\n");
    break;
  case 0xce:
    strcat(acStack_38,"HTTP/1.1 206 Partial Content\r\n");
    break;
  case 300:
    strcat(acStack_38,"HTTP/1.1 300 Multiple Choices\r\n");
    break;
  case 0x12d:
    strcat(acStack_38,"HTTP/1.1 301 Moved Permanently\r\n");
    break;
  case 0x12e:
    strcat(acStack_38,"HTTP/1.1 302 Found\r\n");
    break;
  case 0x12f:
    strcat(acStack_38,"HTTP/1.1 303 See Other\r\n");
    break;
  case 0x130:
    strcat(acStack_38,"HTTP/1.1 304 Not MOdified\r\n");
    break;
  case 0x131:
    strcat(acStack_38,"HTTP/1.1 305 Use Proxy\r\n");
    break;
  case 0x132:
    strcat(acStack_38,"HTTP/1.1 306 Unused\r\n");
    break;
  case 0x133:
    strcat(acStack_38,"HTTP/1.1 307 Temporary\r\n");
    break;
  case 400:
    strcat(acStack_38,"HTTP/1.1 400 Bad Request\r\n");
    break;
  case 0x191:
    strcat(acStack_38,"HTTP/1.1 401 Unauthorized\r\n");
    break;
  case 0x192:
    strcat(acStack_38,"HTTP/1.1 402 Payment Required\r\n");
    break;
  case 0x193:
    strcat(acStack_38,"HTTP/1.1 403 Forbidden\r\n");
    break;
  case 0x194:
    strcat(acStack_38,"HTTP/1.1 404 Not Found\r\n");
    break;
  case 0x195:
    strcat(acStack_38,"HTTP/1.1 405 Mehtod Not Allowed\r\n");
    break;
  case 0x196:
    strcat(acStack_38,"HTTP/1.1 406 Not Acceptable\r\n");
    break;
  case 0x197:
    strcat(acStack_38,"HTTP/1.1 407 Proxy Authentication Required\r\n");
    break;
  case 0x198:
    strcat(acStack_38,"HTTP/1.1 408 Requuest Timeout\r\n");
    break;
  case 0x199:
    strcat(acStack_38,"HTTP/1.1 409 Conflict\r\\n");
    break;
  case 0x19a:
    strcat(acStack_38,"HTTP/1.1 410 Gone\r\n");
    break;
  case 0x19b:
    strcat(acStack_38,"HTTP/1.1 411 Lenth Require\r\n");
    break;
  case 0x19c:
    strcat(acStack_38,"HTTP/1.1 412 Precondition Failed\r\n");
    break;
  case 0x19d:
    strcat(acStack_38,"HTTP/1.1 413 Request Entity Too Large\r\n");
    break;
  case 0x19e:
    strcat(acStack_38,"HTTP/1.1 414 Request-url Too Long\r\n");
    break;
  case 0x19f:
    strcat(acStack_38,"HTTP/1.1 415 Unsupported Media Type\r\n");
    break;
  case 0x1a0:
    strcat(acStack_38,"HTTP/1.1 416\r\n");
    break;
  case 0x1a1:
    strcat(acStack_38,"HTTP/1.1 417 Exceptation Failed\r\n");
    break;
  case 500:
    strcat(acStack_38,"HTTP/1.1 500 Internal Server Error\r\n");
    break;
  case 0x1f5:
    strcat(acStack_38,"HTTP/1.1 501 Not Implemented\r\n");
    break;
  case 0x1f6:
    strcat(acStack_38,"HTTP/1.1 502 Bad Getaway\r\n");
    break;
  case 0x1f7:
    strcat(acStack_38,"HTTP/1.1 503 Service Unavailable\r\n");
    break;
  case 0x1f8:
    strcat(acStack_38,"HTTP/1.1 504 Gateway Timeout\r\n");
    break;
  case 0x1f9:
    strcat(acStack_38,"HTTP/1.1 505 HTTP Version Not Support\r\n");
  }
  return acStack_38;
}

Assistant:

char *get_first_line(int state){
    char *head, h[32] = "";
    switch(state){
        case 100: strcat(h, "HTTP/1.1 100 Continue\r\n"); break;
        case 101: strcat(h, "HTTP/1.1 101 Switching Protocols\r\n"); break;
        case 200: strcat(h, "HTTP/1.1 200 OK\r\n");  break;
        case 201: strcat(h, "HTTP/1.1 201 Created\r\n"); break;
        case 202: strcat(h, "HTTP/1.1 202 Accepted\r\n"); break;
        case 203: strcat(h, "HTTP/1.1 203 Non-authoritative Information\\r\n"); break;
        case 204: strcat(h, "HTTP/1.1 204 No Content\r\n"); break;
        case 205: strcat(h, "HTTP/1.1 205 Reset Content\r\n"); break;
        case 206: strcat(h, "HTTP/1.1 206 Partial Content\r\n"); break;
        case 300: strcat(h, "HTTP/1.1 300 Multiple Choices\r\n"); break;
        case 301: strcat(h, "HTTP/1.1 301 Moved Permanently\r\n"); break;
        case 302: strcat(h, "HTTP/1.1 302 Found\r\n"); break;
        case 303: strcat(h, "HTTP/1.1 303 See Other\r\n"); break;
        case 304: strcat(h, "HTTP/1.1 304 Not MOdified\r\n"); break;
        case 305: strcat(h, "HTTP/1.1 305 Use Proxy\r\n"); break;
        case 306: strcat(h, "HTTP/1.1 306 Unused\r\n"); break;
        case 307: strcat(h, "HTTP/1.1 307 Temporary\r\n"); break;
        case 400: strcat(h, "HTTP/1.1 400 Bad Request\r\n"); break;
        case 401: strcat(h, "HTTP/1.1 401 Unauthorized\r\n"); break;
        case 402: strcat(h, "HTTP/1.1 402 Payment Required\r\n"); break;
        case 403: strcat(h, "HTTP/1.1 403 Forbidden\r\n"); break;
        case 404: strcat(h, "HTTP/1.1 404 Not Found\r\n"); break;
        case 405: strcat(h, "HTTP/1.1 405 Mehtod Not Allowed\r\n"); break;
        case 406: strcat(h, "HTTP/1.1 406 Not Acceptable\r\n"); break;
        case 407: strcat(h, "HTTP/1.1 407 Proxy Authentication Required\r\n"); break;
        case 408: strcat(h, "HTTP/1.1 408 Requuest Timeout\r\n"); break;
        case 409: strcat(h, "HTTP/1.1 409 Conflict\r\\n"); break;
        case 410: strcat(h, "HTTP/1.1 410 Gone\r\n"); break;
        case 411: strcat(h, "HTTP/1.1 411 Lenth Require\r\n"); break;
        case 412: strcat(h, "HTTP/1.1 412 Precondition Failed\r\n"); break;
        case 413: strcat(h, "HTTP/1.1 413 Request Entity Too Large\r\n"); break;
        case 414: strcat(h, "HTTP/1.1 414 Request-url Too Long\r\n"); break;
        case 415: strcat(h, "HTTP/1.1 415 Unsupported Media Type\r\n"); break;
        case 416: strcat(h, "HTTP/1.1 416\r\n"); break;
        case 417: strcat(h, "HTTP/1.1 417 Exceptation Failed\r\n"); break;
        case 500: strcat(h, "HTTP/1.1 500 Internal Server Error\r\n"); break;
        case 501: strcat(h, "HTTP/1.1 501 Not Implemented\r\n"); break;
        case 502: strcat(h, "HTTP/1.1 502 Bad Getaway\r\n"); break;
        case 503: strcat(h, "HTTP/1.1 503 Service Unavailable\r\n"); break;
        case 504: strcat(h, "HTTP/1.1 504 Gateway Timeout\r\n"); break;
        case 505: strcat(h, "HTTP/1.1 505 HTTP Version Not Support\r\n"); break;
        default:
            perror("Unknow state code!");
            exit(1);
    }
    head = h;
    return head;
}